

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spvIR.h
# Opt level: O2

void __thiscall spv::Function::dump(Function *this,Vector<unsigned_int> *out)

{
  pointer ppIVar1;
  int p;
  long lVar2;
  Instruction end;
  _Any_data local_70;
  code *local_60;
  code *local_58;
  Instruction local_50;
  
  Instruction::dump(&this->functionInstruction,out);
  for (lVar2 = 0;
      ppIVar1 = (this->parameterInstructions).
                super__Vector_base<spv::Instruction_*,_dxil_spv::ThreadLocalAllocator<spv::Instruction_*>_>
                ._M_impl.super__Vector_impl_data._M_start,
      lVar2 < (int)((ulong)((long)(this->parameterInstructions).
                                  super__Vector_base<spv::Instruction_*,_dxil_spv::ThreadLocalAllocator<spv::Instruction_*>_>
                                  ._M_impl.super__Vector_impl_data._M_finish - (long)ppIVar1) >> 3);
      lVar2 = lVar2 + 1) {
    Instruction::dump(ppIVar1[lVar2],out);
  }
  local_70._8_8_ = 0;
  local_58 = std::
             _Function_handler<void_(spv::Block_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/third_party/glslang-spirv/spvIR.h:307:36)>
             ::_M_invoke;
  local_60 = std::
             _Function_handler<void_(spv::Block_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/third_party/glslang-spirv/spvIR.h:307:36)>
             ::_M_manager;
  local_70._M_unused._M_object = out;
  inReadableOrder(*(this->blocks).
                   super__Vector_base<spv::Block_*,_dxil_spv::ThreadLocalAllocator<spv::Block_*>_>.
                   _M_impl.super__Vector_impl_data._M_start,
                  (function<void_(spv::Block_*)> *)&local_70);
  std::_Function_base::~_Function_base((_Function_base *)&local_70);
  local_50._vptr_Instruction = (_func_int **)&PTR__Instruction_001e31e0;
  local_50.resultId = 0;
  local_50.typeId = 0;
  local_50.opCode = OpFunctionEnd;
  local_50.operands.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_50.operands.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_50.operands.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_50.block = (Block *)0x0;
  Instruction::dump(&local_50,out);
  Instruction::~Instruction(&local_50);
  return;
}

Assistant:

void dump(dxil_spv::Vector<unsigned int>& out) const
    {
        // OpFunction
        functionInstruction.dump(out);

        // OpFunctionParameter
        for (int p = 0; p < (int)parameterInstructions.size(); ++p)
            parameterInstructions[p]->dump(out);

        // Blocks
        inReadableOrder(blocks[0], [&out](const Block* b) { b->dump(out); });
        Instruction end(0, 0, OpFunctionEnd);
        end.dump(out);
    }